

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::select_toggle(Fl_Tree *this,Fl_Tree_Item *item,int docallback)

{
  char cVar1;
  Fl_Tree_Reason reason;
  int docallback_local;
  Fl_Tree_Item *item_local;
  Fl_Tree *this_local;
  
  Fl_Tree_Item::select_toggle(item);
  Fl_Widget::set_changed((Fl_Widget *)this);
  if (docallback != 0) {
    cVar1 = Fl_Tree_Item::is_selected(item);
    reason = FL_TREE_REASON_DESELECTED;
    if (cVar1 != '\0') {
      reason = FL_TREE_REASON_SELECTED;
    }
    do_callback_for_item(this,item,reason);
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Tree::select_toggle(Fl_Tree_Item *item, int docallback) {
  item->select_toggle();
  set_changed();
  if ( docallback ) {
    do_callback_for_item(item, item->is_selected() ? FL_TREE_REASON_SELECTED
						   : FL_TREE_REASON_DESELECTED);
  }
  redraw();
}